

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void __thiscall HighsHashTable<int,_void>::HighsHashTable(HighsHashTable<int,_void> *this)

{
  unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter> *in_RDI;
  HighsHashTable<int,_void> *unaff_retaddr;
  unique_ptr<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter> *capacity;
  
  capacity = in_RDI;
  std::unique_ptr<HighsHashTableEntry<int,void>,HighsHashTable<int,void>::OpNewDeleter>::
  unique_ptr<HighsHashTable<int,void>::OpNewDeleter,void>(in_RDI);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI);
  in_RDI[4]._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl =
       (HighsHashTableEntry<int,_void> *)0x0;
  makeEmptyTable(unaff_retaddr,(u64)capacity);
  return;
}

Assistant:

HighsHashTable() { makeEmptyTable(128); }